

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O1

void tcg_gen_bitsel_vec_ppc
               (TCGContext_conflict9 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_vec b,TCGv_vec c)

{
  TCGv_vec pTVar1;
  TCGTemp *ts;
  ushort uVar2;
  uintptr_t o_3;
  TCGv_vec pTVar3;
  TCGOp *pTVar4;
  uintptr_t o_2;
  uintptr_t o;
  uintptr_t o_1;
  
  pTVar1 = r + (long)&tcg_ctx->pool_cur;
  pTVar3 = tcg_temp_new_vec_ppc
                     (tcg_ctx,(uint)(byte)((undefined1 *)((long)&tcg_ctx->pool_cur + 2))[(long)r]);
  ts = (TCGTemp *)(pTVar3 + (long)&tcg_ctx->pool_cur);
  uVar2 = *(ushort *)((undefined1 *)((long)&tcg_ctx->pool_cur + 2) + (long)pTVar3);
  pTVar4 = tcg_emit_op_ppc(tcg_ctx,INDEX_op_and_vec);
  pTVar4->field_0x1 = (byte)((uint)uVar2 * 0x100 + 0xe00 >> 8) & 0xf;
  pTVar4->args[0] = (TCGArg)ts;
  pTVar4->args[1] = (TCGArg)(a + (long)tcg_ctx);
  pTVar4->args[2] = (TCGArg)(b + (long)tcg_ctx);
  uVar2 = *(ushort *)((undefined1 *)((long)&tcg_ctx->pool_cur + 2) + (long)r);
  pTVar4 = tcg_emit_op_ppc(tcg_ctx,INDEX_op_andc_vec);
  pTVar4->field_0x1 = (byte)((uint)uVar2 * 0x100 + 0xe00 >> 8) & 0xf;
  pTVar4->args[0] = (TCGArg)pTVar1;
  pTVar4->args[1] = (TCGArg)(c + (long)tcg_ctx);
  pTVar4->args[2] = (TCGArg)(a + (long)tcg_ctx);
  uVar2 = *(ushort *)((undefined1 *)((long)&tcg_ctx->pool_cur + 2) + (long)r);
  pTVar4 = tcg_emit_op_ppc(tcg_ctx,INDEX_op_or_vec);
  pTVar4->field_0x1 = (byte)((uint)uVar2 * 0x100 + 0xe00 >> 8) & 0xf;
  pTVar4->args[0] = (TCGArg)pTVar1;
  pTVar4->args[1] = (TCGArg)pTVar1;
  pTVar4->args[2] = (TCGArg)ts;
  tcg_temp_free_internal_ppc(tcg_ctx,ts);
  return;
}

Assistant:

void tcg_gen_bitsel_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a,
                        TCGv_vec b, TCGv_vec c)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGTemp *bt = tcgv_vec_temp(tcg_ctx, b);
    TCGTemp *ct = tcgv_vec_temp(tcg_ctx, c);
    TCGType type = rt->base_type;

    tcg_debug_assert(at->base_type >= type);
    tcg_debug_assert(bt->base_type >= type);
    tcg_debug_assert(ct->base_type >= type);

    if (TCG_TARGET_HAS_bitsel_vec) {
        vec_gen_4(tcg_ctx, INDEX_op_bitsel_vec, type, MO_8,
                  temp_arg(rt), temp_arg(at), temp_arg(bt), temp_arg(ct));
    } else {
        TCGv_vec t = tcg_temp_new_vec(tcg_ctx, type);
        tcg_gen_and_vec(tcg_ctx, MO_8, t, a, b);
        tcg_gen_andc_vec(tcg_ctx, MO_8, r, c, a);
        tcg_gen_or_vec(tcg_ctx, MO_8, r, r, t);
        tcg_temp_free_vec(tcg_ctx, t);
    }
}